

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void google::protobuf::anon_unknown_6::ReportReflectionUsageError
               (Descriptor *descriptor,FieldDescriptor *field,char *method,char *description)

{
  LogMessage *pLVar1;
  string_view sVar2;
  LogMessage local_40;
  Voidify local_29;
  char *local_28;
  char *description_local;
  char *method_local;
  FieldDescriptor *field_local;
  Descriptor *descriptor_local;
  
  local_28 = description;
  description_local = method;
  method_local = (char *)field;
  field_local = (FieldDescriptor *)descriptor;
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
             ,0xce);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar1,(char (*) [87])
                             "Protocol Buffer reflection usage error:\n  Method      : google::protobuf::Reflection::"
                     );
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<<const_char_*,_0>
                     (pLVar1,&description_local);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar1,(char (*) [18])"\n  Message type: ");
  sVar2 = Descriptor::full_name((Descriptor *)field_local);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,sVar2);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar1,(char (*) [18])"\n  Field       : ");
  sVar2 = FieldDescriptor::full_name((FieldDescriptor *)method_local);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,sVar2);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar1,(char (*) [18])"\n  Problem     : ");
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<<const_char_*,_0>
                     (pLVar1,&local_28);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar1);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

void ReportReflectionUsageError(const Descriptor* descriptor,
                                const FieldDescriptor* field,
                                const char* method, const char* description) {
  ABSL_LOG(FATAL) << "Protocol Buffer reflection usage error:\n"
                     "  Method      : google::protobuf::Reflection::"
                  << method
                  << "\n"
                     "  Message type: "
                  << descriptor->full_name()
                  << "\n"
                     "  Field       : "
                  << field->full_name()
                  << "\n"
                     "  Problem     : "
                  << description;
}